

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBox2dShape.cpp
# Opt level: O1

void __thiscall
cbtBox2dShape::getAabb(cbtBox2dShape *this,cbtTransform *t,cbtVector3 *aabbMin,cbtVector3 *aabbMax)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float in_XMM0_Da;
  undefined1 auVar14 [16];
  
  (*(this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
    super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])();
  fVar4 = in_XMM0_Da +
          (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
          m_implicitShapeDimensions.m_floats[0];
  fVar5 = in_XMM0_Da +
          (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
          m_implicitShapeDimensions.m_floats[1];
  in_XMM0_Da = in_XMM0_Da +
               (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
               m_implicitShapeDimensions.m_floats[2];
  auVar14._8_4_ = 0x7fffffff;
  auVar14._0_8_ = 0x7fffffff7fffffff;
  auVar14._12_4_ = 0x7fffffff;
  auVar6 = vandps_avx(ZEXT416((uint)(t->m_basis).m_el[0].m_floats[0]),auVar14);
  auVar7 = vandps_avx(ZEXT416((uint)(t->m_basis).m_el[0].m_floats[1]),auVar14);
  auVar8 = vandps_avx(ZEXT416((uint)(t->m_basis).m_el[0].m_floats[2]),auVar14);
  auVar9 = vandps_avx(ZEXT416((uint)(t->m_basis).m_el[1].m_floats[0]),auVar14);
  auVar10 = vandps_avx(ZEXT416((uint)(t->m_basis).m_el[1].m_floats[1]),auVar14);
  auVar11 = vandps_avx(ZEXT416((uint)(t->m_basis).m_el[1].m_floats[2]),auVar14);
  auVar12 = vandps_avx(ZEXT416((uint)(t->m_basis).m_el[2].m_floats[0]),auVar14);
  auVar13 = vandps_avx(ZEXT416((uint)(t->m_basis).m_el[2].m_floats[1]),auVar14);
  auVar14 = vandps_avx(ZEXT416((uint)(t->m_basis).m_el[2].m_floats[2]),auVar14);
  fVar1 = (t->m_origin).m_floats[0];
  fVar2 = (t->m_origin).m_floats[1];
  fVar3 = (t->m_origin).m_floats[2];
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * auVar7._0_4_)),ZEXT416((uint)fVar4),auVar6);
  auVar7 = vfmadd231ss_fma(auVar6,ZEXT416((uint)in_XMM0_Da),auVar8);
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * fVar5)),ZEXT416((uint)fVar4),auVar9);
  auVar8 = vfmadd231ss_fma(auVar6,ZEXT416((uint)in_XMM0_Da),auVar11);
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(auVar13._0_4_ * fVar5)),ZEXT416((uint)fVar4),auVar12);
  auVar9 = vfmadd231ss_fma(auVar6,ZEXT416((uint)in_XMM0_Da),auVar14);
  auVar6 = vinsertps_avx(ZEXT416((uint)(fVar1 - auVar7._0_4_)),ZEXT416((uint)(fVar2 - auVar8._0_4_))
                         ,0x10);
  auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)(fVar3 - auVar9._0_4_)),0x28);
  *(undefined1 (*) [16])aabbMin->m_floats = auVar6;
  auVar6 = vinsertps_avx(ZEXT416((uint)(fVar1 + auVar7._0_4_)),ZEXT416((uint)(fVar2 + auVar8._0_4_))
                         ,0x10);
  auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)(fVar3 + auVar9._0_4_)),0x28);
  *(undefined1 (*) [16])aabbMax->m_floats = auVar6;
  return;
}

Assistant:

void cbtBox2dShape::getAabb(const cbtTransform& t, cbtVector3& aabbMin, cbtVector3& aabbMax) const
{
	cbtTransformAabb(getHalfExtentsWithoutMargin(), getMargin(), t, aabbMin, aabbMax);
}